

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverTest_SetIntOption_Test::~SolverTest_SetIntOption_Test(SolverTest_SetIntOption_Test *this)

{
  void *in_RDI;
  
  ~SolverTest_SetIntOption_Test((SolverTest_SetIntOption_Test *)0x164bb8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SolverTest, SetIntOption) {
  TestSolverWithOptions test_solver;
  Solver &s = test_solver;
  s.SetIntOption("intopt1", 11);
  EXPECT_EQ(11, test_solver.intopt1);
  s.SetIntOption("intopt1", 42);
  EXPECT_EQ(42, test_solver.intopt1);
  EXPECT_THROW(s.SetDblOption("intopt1", 0), OptionError);
  EXPECT_THROW(s.SetStrOption("intopt1", ""), OptionError);
  EXPECT_THROW(s.SetIntOption("badopt", 0), OptionError);
}